

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

void __thiscall Logger::queueError(Logger *this,ErrorType type,string_view text)

{
  undefined4 uVar1;
  const_pointer pvVar2;
  char *text_00;
  undefined4 in_register_00000034;
  string local_68;
  undefined1 local_48 [8];
  QueueEntry entry;
  undefined1 auStack_18 [4];
  ErrorType type_local;
  string_view text_local;
  
  _auStack_18 = CONCAT44(in_register_00000034,type);
  text_00 = text._M_str;
  text_local._M_len = text._M_len;
  entry.text.field_2._12_4_ = SUB84(this,0);
  if (suppressLevel == 0) {
    QueueEntry::QueueEntry((QueueEntry *)local_48);
    uVar1 = entry.text.field_2._12_4_;
    local_48._0_4_ = entry.text.field_2._12_4_;
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
    formatError_abi_cxx11_(&local_68,(Logger *)(ulong)(uint)uVar1,(ErrorType)pvVar2,text_00);
    std::__cxx11::string::operator=((string *)&entry,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::vector<Logger::QueueEntry,_std::allocator<Logger::QueueEntry>_>::push_back
              (&queue,(value_type *)local_48);
    QueueEntry::~QueueEntry((QueueEntry *)local_48);
  }
  return;
}

Assistant:

void Logger::queueError(ErrorType type, const std::string_view text)
{
	if (suppressLevel)
		return;

	QueueEntry entry;
	entry.type = type;
	entry.text = formatError(type,text.data());
	queue.push_back(entry);
}